

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_union(lyd_node_leaf_list *leaf,lys_type *type,int store,int ignore_fail,
                 lys_type **resolved_type)

{
  ushort uVar1;
  uint8_t *puVar2;
  lys_type *plVar3;
  lys_type *plVar4;
  undefined4 in_register_0000000c;
  lyd_val lVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  lys_type *plVar9;
  bool bVar10;
  lyd_node *local_60;
  lyd_node *ret;
  int local_50;
  int local_4c;
  int found;
  lyd_val local_40;
  uint8_t local_31;
  
  lVar5.dec64._4_4_ = in_register_0000000c;
  lVar5.int32 = ignore_fail;
  if (type->base != LY_TYPE_UNION) {
    __assert_fail("type->base == LY_TYPE_UNION",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x1d32,
                  "int resolve_union(struct lyd_node_leaf_list *, struct lys_type *, int, int, struct lys_type **)"
                 );
  }
  uVar1 = leaf->value_type;
  if ((uVar1 == 0x88) || (uVar1 == 0xb)) {
    lVar5 = leaf->value;
    local_40 = lVar5;
  }
  else {
    local_40.binary = (char *)0x0;
  }
  if (store != 0) {
    if ((uVar1 & 0x3f) == 2) {
      free((leaf->value).binary);
    }
    (leaf->value).binary = (char *)0x0;
  }
  puVar2 = ly_vlog_hide_location();
  local_31 = *puVar2;
  ly_vlog_hide('\x01');
  local_50 = 0;
  plVar3 = lyp_get_next_union_type(type,(lys_type *)0x0,&local_50);
  _found = CONCAT71((int7)((ulong)lVar5 >> 8),1);
  lVar5 = local_40;
  plVar9 = (lys_type *)0x0;
  if (plVar3 != (lys_type *)0x0) {
    ret = (lyd_node *)&leaf->value_str;
    local_4c = store;
    do {
      local_50 = 0;
      plVar9 = plVar3;
      if (plVar3->base != LY_TYPE_INST) {
        if (plVar3->base == LY_TYPE_LEAFREF) {
          iVar7 = -1;
          if ((ignore_fail != 1) && ((ignore_fail != 2 || ((leaf->schema->flags & 0x400) == 0)))) {
            iVar7 = (int)(plVar3->info).lref.req;
          }
          iVar7 = resolve_leafref(leaf,(plVar3->info).lref.path,iVar7,&local_60);
          bVar10 = iVar7 != 0;
          if ((store == 0) || (iVar7 != 0)) goto LAB_00119f89;
          if ((local_60 == (lyd_node *)0x0) || ((leaf->schema->flags & 0x400) != 0)) {
            _found = 0;
            plVar3 = lyp_parse_value(plVar3,(char **)ret,(lyxml_elem *)0x0,leaf,(lyd_attr *)0x0,1,0)
            ;
            lVar5 = local_40;
            if (plVar3 == (lys_type *)0x0) {
              return -1;
            }
            goto LAB_0011a055;
          }
          (leaf->value).binary = (char *)local_60;
          leaf->value_type = 9;
        }
        else {
          plVar4 = lyp_parse_value(plVar3,(char **)ret,(lyxml_elem *)0x0,leaf,(lyd_attr *)0x0,store,
                                   0);
          if (plVar4 == (lys_type *)0x0) goto LAB_00119f91;
        }
LAB_0011a049:
        _found = 0;
        lVar5 = local_40;
        goto LAB_0011a055;
      }
      lVar5 = local_40;
      if (local_40.binary == (char *)0x0) {
        lVar5 = (lyd_val)ret->schema;
      }
      iVar7 = check_instid_ext_dep(leaf->schema,lVar5.binary);
      iVar8 = -1;
      if ((ignore_fail != 1) && (ignore_fail != 2 || iVar7 == 0)) {
        iVar8 = (int)(plVar3->info).inst.req;
      }
      lVar5 = local_40;
      if (local_40.binary == (char *)0x0) {
        lVar5 = (lyd_val)ret->schema;
      }
      iVar8 = resolve_instid((lyd_node *)leaf,lVar5.binary,iVar8,&local_60);
      lVar5 = local_40;
      bVar10 = iVar8 != 0;
      store = local_4c;
      if ((local_4c != 0) && (iVar8 == 0)) {
        if ((local_60 == (lyd_node *)0x0) || (iVar7 != 0)) {
          (leaf->value).binary = (char *)local_40;
          leaf->value_type = 0x88;
        }
        else {
          (leaf->value).binary = (char *)local_60;
          leaf->value_type = 8;
          if (local_40.binary != (char *)0x0) {
            lydict_remove(leaf->schema->module->ctx,leaf->value_str);
            leaf->value_str = (char *)lVar5;
          }
        }
        _found = 0;
        lVar5.binary = (char *)0x0;
        goto LAB_0011a055;
      }
LAB_00119f89:
      if (!bVar10) goto LAB_0011a049;
LAB_00119f91:
      ly_err_clean(1);
      if (store != 0) {
        if (plVar3->base == LY_TYPE_BITS) {
          free((leaf->value).binary);
        }
        (leaf->value).binary = (char *)0x0;
      }
      plVar3 = lyp_get_next_union_type(type,plVar3,&local_50);
    } while (plVar3 != (lys_type *)0x0);
    plVar9 = (lys_type *)0x0;
    lVar5 = local_40;
  }
LAB_0011a055:
  if (local_31 == '\0') {
    ly_vlog_hide('\0');
  }
  if (lVar5.binary == (char *)0x0) {
    if ((char)found == '\0') goto LAB_0011a0da;
  }
  else {
    if ((char)found == '\0') {
      lydict_remove(leaf->schema->module->ctx,lVar5.binary);
LAB_0011a0da:
      if (resolved_type == (lys_type **)0x0) {
        return 0;
      }
      *resolved_type = plVar9;
      return 0;
    }
    if (leaf->value_type != 0xb) {
      __assert_fail("leaf->value_type == LY_TYPE_UNION",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                    ,0x1da6,
                    "int resolve_union(struct lyd_node_leaf_list *, struct lys_type *, int, int, struct lys_type **)"
                   );
    }
    (leaf->value).binary = (char *)lVar5;
  }
  if ((ignore_fail == 0) || (iVar7 = 0, (type->info).uni.has_ptr_type == 0)) {
    pcVar6 = "";
    if (leaf->value_str != (char *)0x0) {
      pcVar6 = leaf->value_str;
    }
    ly_vlog(LYE_INVAL,LY_VLOG_LYD,leaf,pcVar6,leaf->schema->name);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int
resolve_union(struct lyd_node_leaf_list *leaf, struct lys_type *type, int store, int ignore_fail,
              struct lys_type **resolved_type)
{
    struct lys_type *t;
    struct lyd_node *ret;
    int found, hidden, success = 0, ext_dep, req_inst;
    const char *json_val = NULL;

    assert(type->base == LY_TYPE_UNION);

    if ((leaf->value_type == LY_TYPE_UNION) || (leaf->value_type == (LY_TYPE_INST | LY_TYPE_INST_UNRES))) {
        /* either NULL or instid previously converted to JSON */
        json_val = leaf->value.string;
    }

    if (store) {
        if ((leaf->value_type & LY_DATA_TYPE_MASK) == LY_TYPE_BITS) {
            free(leaf->value.bit);
        }
        memset(&leaf->value, 0, sizeof leaf->value);
    }

    /* turn logging off, we are going to try to validate the value with all the types in order */
    hidden = *ly_vlog_hide_location();
    ly_vlog_hide(1);

    t = NULL;
    found = 0;
    while ((t = lyp_get_next_union_type(type, t, &found))) {
        found = 0;

        switch (t->base) {
        case LY_TYPE_LEAFREF:
            if ((ignore_fail == 1) || ((leaf->schema->flags & LYS_LEAFREF_DEP) && (ignore_fail == 2))) {
                req_inst = -1;
            } else {
                req_inst = t->info.lref.req;
            }

            if (!resolve_leafref(leaf, t->info.lref.path, req_inst, &ret)) {
                if (store) {
                    if (ret && !(leaf->schema->flags & LYS_LEAFREF_DEP)) {
                        /* valid resolved */
                        leaf->value.leafref = ret;
                        leaf->value_type = LY_TYPE_LEAFREF;
                    } else {
                        /* valid unresolved */
                        if (!lyp_parse_value(t, &leaf->value_str, NULL, leaf, NULL, 1, 0)) {
                            return -1;
                        }
                    }
                }

                success = 1;
            }
            break;
        case LY_TYPE_INST:
            ext_dep = check_instid_ext_dep(leaf->schema, (json_val ? json_val : leaf->value_str));
            if ((ignore_fail == 1) || (ext_dep && (ignore_fail == 2))) {
                req_inst = -1;
            } else {
                req_inst = t->info.inst.req;
            }

            if (!resolve_instid((struct lyd_node *)leaf, (json_val ? json_val : leaf->value_str), req_inst, &ret)) {
                if (store) {
                    if (ret && !ext_dep) {
                        /* valid resolved */
                        leaf->value.instance = ret;
                        leaf->value_type = LY_TYPE_INST;

                        if (json_val) {
                            lydict_remove(leaf->schema->module->ctx, leaf->value_str);
                            leaf->value_str = json_val;
                            json_val = NULL;
                        }
                    } else {
                        /* valid unresolved */
                        if (json_val) {
                            /* put the JSON val back */
                            leaf->value.string = json_val;
                            json_val = NULL;
                        } else {
                            leaf->value.instance = NULL;
                        }
                        leaf->value_type = LY_TYPE_INST | LY_TYPE_INST_UNRES;
                    }
                }

                success = 1;
            }
            break;
        default:
            if (lyp_parse_value(t, &leaf->value_str, NULL, leaf, NULL, store, 0)) {
                success = 1;
            }
            break;
        }

        if (success) {
            break;
        }

        /* erase information about errors - they are false or irrelevant
         * and will be replaced by a single error messages */
        ly_err_clean(1);

        /* erase possible present and invalid value data */
        if (store) {
            if (t->base == LY_TYPE_BITS) {
                free(leaf->value.bit);
            }
            memset(&leaf->value, 0, sizeof leaf->value);
        }
    }

    /* turn logging back on */
    if (!hidden) {
        ly_vlog_hide(0);
    }

    if (json_val) {
        if (!success) {
            /* put the value back for now */
            assert(leaf->value_type == LY_TYPE_UNION);
            leaf->value.string = json_val;
        } else {
            /* value was ultimately useless, but we could not have known */
            lydict_remove(leaf->schema->module->ctx, json_val);
        }
    }

    if (success) {
        if (resolved_type) {
            *resolved_type = t;
        }
    } else if (!ignore_fail || !type->info.uni.has_ptr_type) {
        /* not found and it is required */
        LOGVAL(LYE_INVAL, LY_VLOG_LYD, leaf, leaf->value_str ? leaf->value_str : "", leaf->schema->name);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;

}